

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcFinalize(void)

{
  nullres nVar1;
  int iVar2;
  TraceScope traceScope;
  TraceScope TStack_18;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    nVar1 = '\0';
  }
  else {
    if (nullcFinalize::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcFinalize::token);
      if (iVar2 != 0) {
        nullcFinalize::token = NULLC::TraceGetToken("nullc","nullcFinalize");
        __cxa_guard_release(&nullcFinalize::token);
      }
    }
    NULLC::TraceScope::TraceScope(&TStack_18,nullcFinalize::token);
    NULLC::FinalizeMemory();
    NULLC::TraceScope::~TraceScope(&TStack_18);
    nVar1 = '\x01';
  }
  return nVar1;
}

Assistant:

nullres nullcFinalize()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcFinalize");

	FinalizeMemory();

	return 1;
}